

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

void __thiscall
ICM::Compiler::PreliminaryCompile::setDoNode(PreliminaryCompile *this,Node *node,VecElt *dolist)

{
  NodeTable *pNVar1;
  pointer puVar2;
  pointer puVar3;
  Node *node_00;
  size_t sVar4;
  Element e;
  
  pNVar1 = (this->super_AnalysisBase).Table;
  puVar2 = (pNVar1->
           super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (pNVar1->
           super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  node_00 = (Node *)operator_new(0x20);
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::vector
            ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)node_00,dolist
            );
  sVar4 = (long)puVar2 - (long)puVar3 >> 3;
  node_00->index = sVar4;
  e._0_8_ = node_00;
  std::
  vector<std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>,std::allocator<std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>>>
  ::emplace_back<std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>>
            ((vector<std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>,std::allocator<std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>>>
              *)(this->super_AnalysisBase).Table,
             (unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_> *)&e);
  std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>::~unique_ptr
            ((unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_> *)&e);
  e.field_0.type = 2;
  e.index = sVar4;
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::push_back
            (&node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,&e);
  adjustNode(this,node_00,1);
  return;
}

Assistant:

void setDoNode(Node &node, VecElt &dolist) {
				size_t id = Table.size();
				Node *p = new Node(id, std::move(dolist));
				Table.push_back(std::move(std::unique_ptr<Node>(p)));
				Element e = Element::Refer(id);
				node.push_back(e);
				adjustNode(*p, 1);
			}